

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInter.c
# Opt level: O1

int Int_ManGlobalVars(Int_Man_t *p)

{
  Sto_Man_t *pSVar1;
  int *piVar2;
  uint uVar3;
  Sto_Cls_t *pSVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  pSVar1 = p->pCnf;
  pSVar4 = pSVar1->pHead;
  while ((pSVar4 != (Sto_Cls_t *)0x0 && ((~*(uint *)&pSVar4->field_0x1c & 3) == 0))) {
    if ((*(uint *)&pSVar4->field_0x1c & 0x7fffff8) != 0) {
      piVar2 = p->pVarTypes;
      uVar6 = 0;
      do {
        piVar2[*(int *)((long)&pSVar4[1].pNext + uVar6 * 4) >> 1] = 1;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (*(uint *)&pSVar4->field_0x1c >> 3 & 0xffffff));
    }
    pSVar4 = pSVar4->pNext;
  }
  if (p->nGloVars == 0) {
    for (pSVar4 = pSVar1->pHead;
        (pSVar4 != (Sto_Cls_t *)0x0 && ((*(uint *)&pSVar4->field_0x1c & 2) != 0));
        pSVar4 = pSVar4->pNext) {
      if (((*(uint *)&pSVar4->field_0x1c & 1) == 0) &&
         ((*(uint *)&pSVar4->field_0x1c & 0x7fffff8) != 0)) {
        piVar2 = p->pVarTypes;
        uVar6 = 0;
        do {
          iVar5 = *(int *)((long)&pSVar4[1].pNext + uVar6 * 4) >> 1;
          if (piVar2[iVar5] == 1) {
            piVar2[iVar5] = -1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (*(uint *)&pSVar4->field_0x1c >> 3 & 0xffffff));
      }
    }
    if (pSVar1->nVars < 1) {
      return 0;
    }
    piVar2 = p->pVarTypes;
    lVar7 = 0;
    uVar3 = 0;
    do {
      if (piVar2[lVar7] == -1) {
        piVar2[lVar7] = ~uVar3;
        uVar3 = uVar3 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pSVar1->nVars);
  }
  else {
    uVar3 = p->nGloVars;
    if (0 < (int)uVar3) {
      piVar2 = p->pVarTypes;
      iVar5 = -1;
      lVar7 = 0;
      do {
        piVar2[p->pGloVars[lVar7]] = iVar5;
        lVar7 = lVar7 + 1;
        uVar3 = p->nGloVars;
        iVar5 = iVar5 + -1;
      } while (lVar7 < (int)uVar3);
    }
  }
  return uVar3;
}

Assistant:

int Int_ManGlobalVars( Int_Man_t * p )
{
    Sto_Cls_t * pClause;
    int Var, nVarsAB, v;

    // mark the variable encountered in the clauses of A
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( !pClause->fA )
            break;
        for ( v = 0; v < (int)pClause->nLits; v++ )
            p->pVarTypes[lit_var(pClause->pLits[v])] = 1;
    }

    if ( p->nGloVars )
    {
        for ( v = 0; v < p->nGloVars; v++ )
            p->pVarTypes[ p->pGloVars[v] ] = - v - 1;
        return p->nGloVars;
    }

    // check variables that appear in clauses of B
    nVarsAB = 0;
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( pClause->fA )
            continue;
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( p->pVarTypes[Var] == 1 ) // var of A
            {
                // change it into a global variable
                nVarsAB++;
                p->pVarTypes[Var] = -1;
            }
        }
    }

    // order global variables
    nVarsAB = 0;
    for ( v = 0; v < p->pCnf->nVars; v++ )
        if ( p->pVarTypes[v] == -1 )
            p->pVarTypes[v] -= nVarsAB++;
//printf( "There are %d global variables.\n", nVarsAB );
    return nVarsAB;
}